

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O2

void __thiscall hwnet::ThreadPool::~ThreadPool(ThreadPool *this)

{
  ulong uVar1;
  
  TaskQueue::Close(&this->queue_);
  for (uVar1 = 0;
      uVar1 < (ulong)((long)(this->threads_).
                            super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->threads_).
                            super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3); uVar1 = uVar1 + 1) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->threads_);
  TaskQueue::~TaskQueue(&this->queue_);
  return;
}

Assistant:

ThreadPool::~ThreadPool() {
	queue_.Close();
	size_t i = 0;
	for( ; i < threads_.size(); ++i) {
		threads_[i].join();
	}	
}